

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void __thiscall slang::SVInt::setAllZ(SVInt *this)

{
  uint32_t i;
  uint64_t *puVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SVIntStorage).bitWidth;
  if ((this->super_SVIntStorage).unknownFlag == true) {
    uVar3 = uVar3 + 0x3f;
  }
  else {
    if ((0x40 < uVar3) &&
       (puVar1 = (this->super_SVIntStorage).field_0.pVal, puVar1 != (uint64_t *)0x0)) {
      operator_delete__(puVar1);
      uVar3 = (this->super_SVIntStorage).bitWidth;
    }
    (this->super_SVIntStorage).unknownFlag = true;
    uVar3 = uVar3 + 0x3f;
    puVar1 = (uint64_t *)operator_new__((ulong)(uVar3 >> 2 & 0xfffffff0));
    (this->super_SVIntStorage).field_0.pVal = puVar1;
  }
  for (uVar2 = 0; uVar2 < (uVar3 >> 6) << 1; uVar2 = uVar2 + 1) {
    (this->super_SVIntStorage).field_0.pVal[uVar2] = 0xffffffffffffffff;
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllZ() {
    if (!unknownFlag) {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[getNumWords()];
    }

    // everything set to 1 (for Z in the low half and for unknown in the upper half)
    for (uint32_t i = 0; i < getNumWords(); i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}